

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_assertion_tests.cpp
# Opt level: O1

void ExceptionFunction(int i)

{
  undefined8 *puVar1;
  string *psVar2;
  undefined *puVar3;
  
  switch(i) {
  case 1:
    puVar1 = (undefined8 *)__cxa_allocate_exception(4);
    *(undefined4 *)puVar1 = 2;
    puVar3 = &int::typeinfo;
    break;
  case 2:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = vsnprintf;
    __cxa_throw(puVar1,&std::bad_exception::typeinfo,std::bad_exception::~bad_exception);
  case 3:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "error";
    puVar3 = &char_const*::typeinfo;
    break;
  case 4:
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar2 = psVar2 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar2,"error","");
    __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  case 5:
    puVar1 = (undefined8 *)__cxa_allocate_exception(4);
    *(undefined4 *)puVar1 = 0x3dcccccd;
    puVar3 = &float::typeinfo;
    break;
  default:
    return;
  }
  __cxa_throw(puVar1,puVar3,0);
}

Assistant:

static void ExceptionFunction(int i)
{
    switch( i )
    {
    case 0:
        return;
    case 1:
        throw 2;
    case 2:
        throw ::std::bad_exception();
    case 3:
        throw "error";
    case 4:
        throw ::std::string("error");
    case 5:
        throw 0.1f;
    case -1:
        {
            int* p = reinterpret_cast<int*>(0x1234);
            *p = 1;
        }
        break;
    default:
        break;
    }
}